

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O1

void __thiscall spvtools::opt::LoopFissionPass::LoopFissionPass(LoopFissionPass *this)

{
  _func_bool__Any_data_ptr_RegionRegisterLiveness_ptr *__tmp_1;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__LoopFissionPass_00951270;
  *(undefined8 *)&(this->split_criteria_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->split_criteria_).super__Function_base._M_functor + 8) = 0;
  (this->split_criteria_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->split_criteria_)._M_invoker = (_Invoker_type)0x0;
  this->split_multiple_times_ = false;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  *(undefined8 *)&(this->split_criteria_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->split_criteria_).super__Function_base._M_functor + 8) = 0;
  local_18 = (this->split_criteria_).super__Function_base._M_manager;
  (this->split_criteria_).super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_spvtools::opt::RegisterLiveness::RegionRegisterLiveness_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fission.cpp:434:21)>
       ::_M_manager;
  local_10 = (this->split_criteria_)._M_invoker;
  (this->split_criteria_)._M_invoker =
       std::
       _Function_handler<bool_(const_spvtools::opt::RegisterLiveness::RegionRegisterLiveness_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_fission.cpp:434:21)>
       ::_M_invoke;
  if (local_18 != (_Manager_type)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

LoopFissionPass::LoopFissionPass() : split_multiple_times_(false) {
  // Split by default.
  split_criteria_ = [](const RegisterLiveness::RegionRegisterLiveness&) {
    return true;
  };
}